

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnNameEntry
          (BinaryReaderIR *this,NameSectionSubsection type,Index index,string_view name)

{
  pointer ppTVar1;
  TypeEntry *pTVar2;
  pointer ppEVar3;
  pointer ppMVar4;
  pointer ppDVar5;
  pointer ppTVar6;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string *orig_name;
  ElemSegment *pEVar7;
  string *psVar8;
  char *format;
  Module *pMVar9;
  long lVar10;
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
  *p_Var11;
  string dollar_name;
  size_t in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  Tag *pTVar12;
  undefined1 local_78 [72];
  
  orig_name = (string *)name._M_len;
  switch(type) {
  case Type:
    if (orig_name == (string *)0x0) {
      return (Result)Ok;
    }
    pMVar9 = this->module_;
    ppTVar1 = (pMVar9->types).
              super__Vector_base<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)index <
        (ulong)((long)(pMVar9->types).
                      super__Vector_base<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppTVar1 >> 3)) {
      pTVar2 = ppTVar1[index];
      lVar10 = 600;
      name_00._M_str = in_stack_ffffffffffffff80;
      name_00._M_len = in_stack_ffffffffffffff78;
      (anonymous_namespace)::MakeDollarName_abi_cxx11_(name_00);
      GetUniqueName((string *)(local_78 + 0x28),(BinaryReaderIR *)&pMVar9->type_bindings,
                    (BindingHash *)local_78,orig_name);
      std::__cxx11::string::_M_dispose();
      psVar8 = (string *)&pTVar2->name;
LAB_00117811:
      std::__cxx11::string::_M_assign(psVar8);
      p_Var11 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
                 *)((long)&(this->module_->loc).filename._M_len + lVar10);
LAB_001178c5:
      local_78._20_8_ = 0;
      local_78._16_4_ = 0;
      local_78._12_4_ = 0;
      local_78._8_4_ = 0;
      local_78._0_8_ = (__buckets_ptr)0x0;
      local_78._32_4_ = index;
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
      ::_M_emplace<std::__cxx11::string&,wabt::Binding>(p_Var11,local_78 + 0x28,local_78);
      std::__cxx11::string::_M_dispose();
      return (Result)Ok;
    }
    format = "invalid type index: %u";
    break;
  case Table:
    SetTableName(this,index,name);
    return (Result)Ok;
  case Memory:
    if (orig_name == (string *)0x0) {
      return (Result)Ok;
    }
    pMVar9 = this->module_;
    ppMVar4 = (pMVar9->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)index <
        (ulong)((long)(pMVar9->memories).
                      super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppMVar4 >> 3)) {
      pTVar12 = (Tag *)ppMVar4[index];
      lVar10 = 0x2c8;
LAB_00117875:
      name_02._M_str = (char *)pTVar12;
      name_02._M_len = in_stack_ffffffffffffff78;
      (anonymous_namespace)::MakeDollarName_abi_cxx11_(name_02);
      GetUniqueName((string *)(local_78 + 0x28),
                    (BinaryReaderIR *)((long)&(pMVar9->loc).filename._M_len + lVar10),
                    (BindingHash *)local_78,orig_name);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_assign((string *)pTVar12);
      p_Var11 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
                 *)((long)&(this->module_->loc).filename._M_len + lVar10);
      goto LAB_001178c5;
    }
    format = "invalid memory index: %u";
    break;
  case Global:
    SetGlobalName(this,index,name);
    return (Result)Ok;
  case ElemSegment:
    if (orig_name == (string *)0x0) {
      return (Result)Ok;
    }
    pMVar9 = this->module_;
    ppEVar3 = (pMVar9->elem_segments).
              super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)index <
        (ulong)((long)(pMVar9->elem_segments).
                      super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppEVar3 >> 3)) {
      pEVar7 = ppEVar3[index];
      lVar10 = 0x338;
LAB_001177df:
      name_01._M_str = in_stack_ffffffffffffff80;
      name_01._M_len = in_stack_ffffffffffffff78;
      (anonymous_namespace)::MakeDollarName_abi_cxx11_(name_01);
      GetUniqueName((string *)(local_78 + 0x28),
                    (BinaryReaderIR *)((long)&(pMVar9->loc).filename._M_len + lVar10),
                    (BindingHash *)local_78,orig_name);
      std::__cxx11::string::_M_dispose();
      psVar8 = (string *)&pEVar7->name;
      goto LAB_00117811;
    }
    format = "invalid elem segment index: %u";
    break;
  case DataSegment:
    if (orig_name == (string *)0x0) {
      return (Result)Ok;
    }
    pMVar9 = this->module_;
    ppDVar5 = (pMVar9->data_segments).
              super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)index <
        (ulong)((long)(pMVar9->data_segments).
                      super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppDVar5 >> 3)) {
      pEVar7 = (ElemSegment *)ppDVar5[index];
      lVar10 = 0x300;
      goto LAB_001177df;
    }
    format = "invalid data segment index: %u";
    break;
  case Last:
    if (orig_name == (string *)0x0) {
      return (Result)Ok;
    }
    pMVar9 = this->module_;
    ppTVar6 = (pMVar9->tags).super__Vector_base<wabt::Tag_*,_std::allocator<wabt::Tag_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)index <
        (ulong)((long)(pMVar9->tags).super__Vector_base<wabt::Tag_*,_std::allocator<wabt::Tag_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppTVar6 >> 3)) {
      pTVar12 = ppTVar6[index];
      lVar10 = 0x178;
      goto LAB_00117875;
    }
    format = "invalid tag index: %u";
    break;
  default:
    goto switchD_0011768f_default;
  }
  PrintError(this,format,(ulong)index);
switchD_0011768f_default:
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnNameEntry(NameSectionSubsection type,
                                   Index index,
                                   std::string_view name) {
  switch (type) {
    // TODO(sbc): remove OnFunctionName in favor of just using
    // OnNameEntry so that this works
    case NameSectionSubsection::Function:
    case NameSectionSubsection::Local:
    case NameSectionSubsection::Module:
    case NameSectionSubsection::Label:
      break;
    case NameSectionSubsection::Type:
      SetTypeName(index, name);
      break;
    case NameSectionSubsection::Tag:
      SetTagName(index, name);
      break;
    case NameSectionSubsection::Global:
      SetGlobalName(index, name);
      break;
    case NameSectionSubsection::Table:
      SetTableName(index, name);
      break;
    case NameSectionSubsection::DataSegment:
      SetDataSegmentName(index, name);
      break;
    case NameSectionSubsection::Memory:
      SetMemoryName(index, name);
      break;
    case NameSectionSubsection::ElemSegment:
      SetElemSegmentName(index, name);
      break;
  }
  return Result::Ok;
}